

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          string *config,cmNinjaTargetDepends depends)

{
  value_type *__x;
  cmAlphaNum *this_00;
  bool bVar1;
  TargetType TVar2;
  string *__x_00;
  cmLocalGenerator *this_01;
  string *psVar3;
  string local_160 [32];
  undefined1 local_140 [8];
  string output;
  cmAlphaNum local_f0;
  undefined1 local_c0 [8];
  string path;
  string local_80;
  value_type local_50;
  byte local_2d;
  cmNinjaTargetDepends local_2c;
  bool realname;
  string *psStack_28;
  cmNinjaTargetDepends depends_local;
  string *config_local;
  cmNinjaDeps *outputs_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_2c = depends;
  psStack_28 = config;
  config_local = (string *)outputs;
  outputs_local = (cmNinjaDeps *)target;
  target_local = (cmGeneratorTarget *)this;
  local_2d = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)outputs_local);
  psVar3 = config_local;
  switch(TVar2) {
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (local_2c == DependOnTargetOrdering) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
                (&local_50,this,outputs_local,psStack_28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)psVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
  case EXECUTABLE:
    cmGeneratorTarget::GetFullPath
              (&local_80,(cmGeneratorTarget *)outputs_local,psStack_28,RuntimeBinaryArtifact,
               (bool)(local_2d & 1));
    __x_00 = ConvertToNinjaPath(this,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar3,__x_00);
    std::__cxx11::string::~string((string *)&local_80);
    break;
  case OBJECT_LIBRARY:
    if (local_2c == DependOnTargetOrdering) {
      __x = (value_type *)((long)&path.field_2 + 8);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
                (__x,this,outputs_local,psStack_28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)psVar3,__x);
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      return;
    }
  case UTILITY:
  case GLOBAL_TARGET:
  case INTERFACE_LIBRARY:
    this_01 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)outputs_local);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
    cmAlphaNum::cmAlphaNum(&local_f0,psVar3);
    this_00 = (cmAlphaNum *)((long)&output.field_2 + 8);
    cmAlphaNum::cmAlphaNum(this_00,'/');
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)outputs_local);
    cmStrCat<std::__cxx11::string>((string *)local_c0,&local_f0,this_00,psVar3);
    psVar3 = ConvertToNinjaPath(this,(string *)local_c0);
    std::__cxx11::string::string((string *)local_140,(string *)psVar3);
    bVar1 = cmTarget::IsPerConfig
                      ((cmTarget *)
                       (outputs_local->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (local_160,this,local_140,psStack_28);
      std::__cxx11::string::operator=((string *)local_140,local_160);
      std::__cxx11::string::~string(local_160);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)config_local,(value_type *)local_140);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_c0);
    break;
  case UNKNOWN_LIBRARY:
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  const std::string& config, cmNinjaTargetDepends depends) const
{
  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        config, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY: {
      std::string path =
        cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), '/',
                 target->GetName());
      std::string output = this->ConvertToNinjaPath(path);
      if (target->Target->IsPerConfig()) {
        output = this->BuildAlias(output, config);
      }
      outputs.push_back(output);
      break;
    }

    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
}